

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2FullMatchZeroArg(void)

{
  bool bVar1;
  StringPiece local_198;
  LogMessage local_188;
  
  RE2::RE2((RE2 *)&local_188,"\\d+");
  local_198.ptr_ = "1001";
  local_198.length_ = 4;
  bVar1 = RE2::FullMatchN(&local_198,(RE2 *)&local_188,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_188);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x26a,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188.str_,"Check failed: RE2::FullMatch(\"1001\", \"\\\\d+\")",0x2c)
    ;
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_188);
  }
  return;
}

Assistant:

TEST(RE2, FullMatchZeroArg) {
  // Zero-arg
  CHECK(RE2::FullMatch("1001", "\\d+"));
}